

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O1

Paint * __thiscall
lunasvg::parsePaint(Paint *__return_storage_ptr__,lunasvg *this,string_view input,
                   SVGLayoutState *state,Color *defaultValue)

{
  string_view input_00;
  bool bVar1;
  Color CVar2;
  byte *pbVar3;
  lunasvg *plVar4;
  string_view input_01;
  string id;
  string_view local_58;
  string local_48;
  
  local_58._M_str = (char *)input._M_len;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_58._M_len = (size_t)this;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  bVar1 = parseUrlValue(&local_58,&local_48);
  if (bVar1) {
    bVar1 = (lunasvg *)local_58._M_len != (lunasvg *)0x0;
    if (bVar1) {
      bVar1 = true;
      do {
        plVar4 = (lunasvg *)(local_58._M_len + -1);
        pbVar3 = (byte *)(local_58._M_str + 1);
        if ((0x20 < (ulong)(byte)*local_58._M_str) ||
           ((0x100002600U >> ((ulong)(byte)*local_58._M_str & 0x3f) & 1) == 0)) break;
        bVar1 = (lunasvg *)local_58._M_len != (lunasvg *)0x1;
        local_58._M_len = (size_t)plVar4;
        local_58._M_str = (char *)pbVar3;
      } while (plVar4 != (lunasvg *)0x0);
    }
    if (bVar1) {
      input_00._M_str = local_58._M_str;
      input_00._M_len = local_58._M_len;
      CVar2 = parseColorOrNone(input_00,(SVGLayoutState *)input._M_str,(Color *)state);
      (__return_storage_ptr__->m_id)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_id).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_48._M_dataplus._M_p,
                 local_48._M_dataplus._M_p + local_48._M_string_length);
      (__return_storage_ptr__->m_color).m_value = CVar2.m_value;
      goto LAB_00116a1e;
    }
    (__return_storage_ptr__->m_id)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_id).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    CVar2.m_value = 0;
  }
  else {
    input_01._M_str = local_58._M_str;
    input_01._M_len = local_58._M_len;
    CVar2 = parseColorOrNone(input_01,(SVGLayoutState *)input._M_str,(Color *)state);
    (__return_storage_ptr__->m_id)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_id).field_2;
    (__return_storage_ptr__->m_id)._M_string_length = 0;
    (__return_storage_ptr__->m_id).field_2._M_local_buf[0] = '\0';
  }
  (__return_storage_ptr__->m_color).m_value = CVar2.m_value;
LAB_00116a1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Paint parsePaint(std::string_view input, const SVGLayoutState* state, const Color& defaultValue)
{
    std::string id;
    if(!parseUrlValue(input, id))
        return Paint(parseColorOrNone(input, state, defaultValue));
    if(skipOptionalSpaces(input))
        return Paint(id, parseColorOrNone(input, state, defaultValue));
    return Paint(id, Color::Transparent);
}